

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::search(Forth *this)

{
  uint uVar1;
  uint src;
  size_type sVar2;
  ForthStack<unsigned_int> *this_00;
  int local_78;
  size_type result;
  string Word2;
  undefined1 local_40 [8];
  string Word1;
  CAddr caddr1;
  uint length1;
  CAddr caddr2;
  uint length2;
  Forth *this_local;
  
  requireDStackDepth(this,4,"SEARCH");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  src = ForthStack<unsigned_int>::getTop(this_00);
  Word1.field_2._12_4_ = ForthStack<unsigned_int>::getTop(this_00,1);
  Word1.field_2._8_4_ = ForthStack<unsigned_int>::getTop(this_00,2);
  std::__cxx11::string::string((string *)local_40);
  moveFromDataSpace(this,(string *)local_40,Word1.field_2._8_4_,(ulong)(uint)Word1.field_2._12_4_);
  std::__cxx11::string::string((string *)&result);
  moveFromDataSpace(this,(string *)&result,src,(ulong)uVar1);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,0)
  ;
  if (sVar2 == 0xffffffffffffffff) {
    ForthStack<unsigned_int>::setTop(&this->dStack,this->False);
  }
  else {
    ForthStack<unsigned_int>::setTop(&this->dStack,this->True);
    local_78 = (int)sVar2;
    ForthStack<unsigned_int>::setTop(&this->dStack,1,Word1.field_2._12_4_ - local_78);
    ForthStack<unsigned_int>::setTop(&this->dStack,2,Word1.field_2._8_4_ + local_78);
  }
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void search(){
			REQUIRE_DSTACK_DEPTH(4, "SEARCH");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); 
			auto length1 = dStack.getTop(1); 
			auto caddr1 = CADDR(dStack.getTop(2)); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.find(Word2,0);
			if(result!=std::string::npos){
				dStack.setTop(True);
				dStack.setTop(1,length1-CELL(result));
				dStack.setTop(2,caddr1+CELL(result));

			} else {
				dStack.setTop(False);
				// dStack.setTop(1,length1); // not changed
				// dStack.setTop(2,caddr1);	 // not changed
			}
			
		}